

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrj_.c
# Opt level: O2

void hybrj_(minpack_funcder_nn fcnder_nn,int *n,double *x,double *fvec,double *fjac,int *ldfjac,
           double *xtol,int *maxfev,double *diag,int *mode,double *factor,int *nprint,int *info,
           int *nfev,int *njev,double *r__,int *lr,double *qtf,double *wa1,double *wa2,double *wa3,
           double *wa4)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint *m;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  double *pdVar8;
  ulong uVar9;
  double *pdVar10;
  uint uVar11;
  ulong uVar12;
  double *pdVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  int iflag;
  uint *local_120;
  double *local_118;
  double *local_110;
  double delta;
  int *local_100;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  double local_e8;
  ulong local_e0;
  minpack_funcder_nn local_d8;
  int local_cc;
  int sing;
  int c__1;
  ulong local_c0;
  double local_b8;
  undefined8 uStack_b0;
  double *local_a0;
  double local_98;
  double local_90;
  int c_false;
  double *local_80;
  long local_78;
  long local_70;
  double *local_68;
  int iwa [1];
  
  c_false = 0;
  c__1 = 1;
  local_c0 = (ulong)*ldfjac;
  local_118 = fvec;
  local_110 = fjac;
  local_100 = ldfjac;
  local_d8 = fcnder_nn;
  dVar17 = dpmpar_(&c__1);
  *info = 0;
  iflag = 0;
  *nfev = 0;
  *njev = 0;
  uVar5 = *n;
  if ((int)uVar5 < 1) goto LAB_001017b6;
  if ((((*local_100 < (int)uVar5) || (*xtol <= 0.0 && *xtol != 0.0)) || (*maxfev < 1)) ||
     ((*factor <= 0.0 || (*lr < (int)((uVar5 + 1) * uVar5 >> 1))))) {
LAB_001017a4:
    if (-1 < iflag) goto LAB_001017b6;
  }
  else {
    if (*mode == 2) {
      uVar6 = 0;
      do {
        if (uVar5 == uVar6) goto LAB_0010181a;
        pdVar10 = diag + uVar6;
        uVar6 = uVar6 + 1;
      } while (0.0 < *pdVar10);
      goto LAB_001017a4;
    }
LAB_0010181a:
    iflag = 1;
    local_120 = (uint *)n;
    local_98 = dVar17;
    (*local_d8)(n,x,local_118,local_110,local_100,&iflag);
    uVar6 = local_c0;
    *nfev = 1;
    n = (int *)local_120;
    if (-1 < iflag) {
      uVar16 = ~local_c0;
      local_80 = local_110 + uVar16;
      local_b8 = enorm_((int *)local_120,local_118);
      local_78 = uVar6 * 8;
      local_a0 = local_110 + uVar6 + uVar16 + 1;
      local_70 = uVar6 * 8 + 8;
      local_68 = r__ + -1;
      local_e0 = 1;
      local_ec = 0;
      local_e8 = 0.0;
      local_f4 = 0;
      local_f8 = 0;
      local_f0 = 0;
      pdVar10 = local_80;
LAB_0010193c:
      iflag = 2;
      (*local_d8)((int *)local_120,x,local_118,local_110,local_100,&iflag);
      *njev = *njev + 1;
      n = (int *)local_120;
      if (-1 < iflag) {
        qrfac_((int *)local_120,(int *)local_120,local_110,local_100,&c_false,iwa,&c__1,wa1,wa2,wa3)
        ;
        if ((int)local_e0 == 1) {
          uVar5 = *local_120;
          if ((int)uVar5 < 1) {
            uVar5 = 0;
          }
          if (*mode != 2) {
            for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
              uVar16 = -(ulong)(wa2[uVar6] == 0.0);
              diag[uVar6] = (double)(uVar16 & 0x3ff0000000000000 | ~uVar16 & (ulong)wa2[uVar6]);
            }
          }
          for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
            wa3[uVar6] = diag[uVar6] * x[uVar6];
          }
          local_e8 = enorm_((int *)local_120,wa3);
          delta = local_e8 * *factor;
          if ((delta == 0.0) && (!NAN(delta))) {
            delta = *factor;
          }
        }
        uVar5 = *local_120;
        uVar6 = 0;
        if (0 < (int)uVar5) {
          uVar6 = (ulong)uVar5;
        }
        uVar16 = (ulong)((int)uVar6 + 1);
        for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
          qtf[uVar9] = local_118[uVar9];
        }
        uVar9 = (ulong)(uVar5 + 1);
        pdVar8 = qtf;
        pdVar13 = local_a0;
        for (uVar6 = 1; uVar9 = uVar9 - 1, uVar6 != uVar16; uVar6 = uVar6 + 1) {
          dVar17 = pdVar10[uVar6 * local_c0 + uVar6];
          if ((dVar17 != 0.0) || (NAN(dVar17))) {
            dVar20 = 0.0;
            for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
              dVar20 = dVar20 + pdVar13[uVar12] * pdVar8[uVar12];
            }
            for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
              pdVar8[uVar12] = pdVar13[uVar12] * (-dVar20 / dVar17) + pdVar8[uVar12];
            }
          }
          pdVar13 = (double *)((long)pdVar13 + local_70);
          pdVar8 = pdVar8 + 1;
        }
        sing = 0;
        lVar7 = 0;
        pdVar10 = local_a0;
        for (uVar6 = 1; uVar6 != uVar16; uVar6 = uVar6 + 1) {
          if (uVar6 < 2) {
            iVar15 = (int)uVar6;
          }
          else {
            lVar14 = 0;
            uVar9 = uVar6 & 0xffffffff;
            uVar11 = uVar5;
            while( true ) {
              uVar11 = uVar11 - 1;
              iVar15 = (int)uVar9;
              if (lVar7 == lVar14) break;
              r__[(long)iVar15 + -1] = pdVar10[lVar14];
              uVar9 = (ulong)(iVar15 + uVar11);
              lVar14 = lVar14 + 1;
            }
          }
          dVar17 = wa1[uVar6 - 1];
          r__[(long)iVar15 + -1] = dVar17;
          if ((dVar17 == 0.0) && (!NAN(dVar17))) {
            sing = 1;
          }
          pdVar10 = (double *)((long)pdVar10 + local_78);
          lVar7 = lVar7 + 1;
        }
        qform_((int *)local_120,(int *)local_120,local_110,local_100,wa1);
        if (*mode != 2) {
          uVar6 = (ulong)*local_120;
          if ((int)*local_120 < 1) {
            uVar6 = 0;
          }
          for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
            uVar9 = -(ulong)(wa2[uVar16] <= diag[uVar16]);
            diag[uVar16] = (double)(~uVar9 & (ulong)wa2[uVar16] | (ulong)diag[uVar16] & uVar9);
          }
        }
        local_cc = 1;
        do {
          if (((0 < *nprint) && (iflag = 0, ((int)local_e0 + -1) % *nprint == 0)) &&
             ((*local_d8)((int *)local_120,x,local_118,local_110,local_100,&iflag),
             n = (int *)local_120, iflag < 0)) break;
          dogleg_((int *)local_120,r__,lr,diag,qtf,&delta,wa1,wa2,wa3);
          uVar6 = (ulong)*local_120;
          if ((int)*local_120 < 1) {
            uVar6 = 0;
          }
          for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
            dVar17 = wa1[uVar16];
            wa1[uVar16] = -dVar17;
            wa2[uVar16] = x[uVar16] - dVar17;
            wa3[uVar16] = diag[uVar16] * wa1[uVar16];
          }
          dVar17 = enorm_((int *)local_120,wa3);
          n = (int *)local_120;
          if ((int)local_e0 == 1) {
            delta = (double)(~-(ulong)(delta <= dVar17) & (ulong)dVar17 |
                            (ulong)delta & -(ulong)(delta <= dVar17));
          }
          iflag = 1;
          (*local_d8)((int *)local_120,wa2,wa4,local_110,local_100,&iflag);
          pdVar10 = local_80;
          *nfev = *nfev + 1;
          if (iflag < 0) break;
          local_90 = enorm_(n,wa4);
          uVar5 = *local_120;
          uVar6 = (ulong)(uVar5 + 1);
          if ((int)uVar5 < 1) {
            uVar5 = 0;
          }
          uVar16 = 1;
          pdVar8 = wa1;
          for (uVar9 = uVar16; uVar6 = uVar6 - 1, uVar9 != uVar5 + 1; uVar9 = uVar9 + 1) {
            dVar20 = 0.0;
            for (uVar12 = 0; uVar6 != uVar12; uVar12 = uVar12 + 1) {
              dVar20 = dVar20 + local_68[(long)(int)uVar16 + uVar12] * pdVar8[uVar12];
            }
            uVar16 = (long)(int)uVar16 + (uVar6 & 0xffffffff);
            wa3[uVar9 - 1] = dVar20 + qtf[uVar9 - 1];
            pdVar8 = pdVar8 + 1;
          }
          dVar20 = (double)(~-(ulong)(local_90 < local_b8) & 0xbff0000000000000 |
                           (ulong)(1.0 - (local_90 / local_b8) * (local_90 / local_b8)) &
                           -(ulong)(local_90 < local_b8));
          dVar18 = enorm_((int *)local_120,wa3);
          dVar18 = (double)(-(ulong)(dVar18 < local_b8) &
                           (ulong)(1.0 - (dVar18 / local_b8) * (dVar18 / local_b8)));
          dVar18 = (double)(-(ulong)(0.0 < dVar18) & (ulong)(dVar20 / dVar18));
          if (0.1 <= dVar18) {
            dVar19 = dVar17 + dVar17;
            if (0 < local_ec || 0.5 <= dVar18) {
              delta = (double)(~-(ulong)(dVar19 <= delta) & (ulong)dVar19 |
                              (ulong)delta & -(ulong)(dVar19 <= delta));
            }
            local_ec = local_ec + 1;
            iVar15 = 0;
            if (ABS(dVar18 + -1.0) <= 0.1) {
              delta = dVar19;
            }
          }
          else {
            iVar15 = local_f0 + 1;
            local_ec = 0;
            delta = delta * 0.5;
          }
          dVar19 = local_e8;
          dVar21 = local_b8;
          if (0.0001 <= dVar18) {
            uVar6 = (ulong)*local_120;
            if ((int)*local_120 < 1) {
              uVar6 = 0;
            }
            for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
              dVar19 = wa2[uVar16];
              x[uVar16] = dVar19;
              wa2[uVar16] = dVar19 * diag[uVar16];
              local_118[uVar16] = wa4[uVar16];
            }
            uStack_b0 = 0;
            local_b8 = dVar18;
            dVar19 = enorm_((int *)local_120,wa2);
            local_e0 = (ulong)((int)local_e0 + 1);
            dVar21 = local_90;
            dVar18 = local_b8;
          }
          m = local_120;
          iVar3 = local_f4 + 1;
          if (0.001 <= dVar20) {
            iVar3 = 0;
          }
          iVar4 = local_f8 + local_cc;
          if (0.1 <= dVar20) {
            iVar4 = 0;
          }
          n = (int *)local_120;
          if ((delta <= *xtol * dVar19) || ((dVar21 == 0.0 && (!NAN(dVar21))))) {
            iVar15 = 1;
LAB_001023a6:
            *info = iVar15;
            goto LAB_001017a4;
          }
          if (*info != 0) goto LAB_001017a4;
          iVar1 = *nfev;
          iVar2 = *maxfev;
          if (iVar2 <= iVar1) {
            *info = 2;
          }
          if (((iVar3 == 10) || (iVar4 == 5)) ||
             (uVar6 = -(ulong)(dVar17 <= delta * 0.1),
             (double)(~uVar6 & (ulong)dVar17 | (ulong)(delta * 0.1) & uVar6) * 0.1 <=
             local_98 * dVar19)) {
            iVar15 = 5;
            if (iVar3 != 10) {
              iVar15 = (iVar4 == 5) + 3;
            }
            goto LAB_001023a6;
          }
          if (iVar2 <= iVar1) goto LAB_001017a4;
          local_f8 = iVar4;
          local_f4 = iVar3;
          local_e8 = dVar19;
          if (iVar15 == 2) goto LAB_0010236b;
          uVar11 = *local_120;
          uVar5 = uVar11 + 1;
          if ((int)uVar11 < 1) {
            uVar11 = 0;
          }
          pdVar10 = local_a0;
          for (uVar6 = 1; uVar6 != uVar11 + 1; uVar6 = uVar6 + 1) {
            dVar20 = 0.0;
            for (lVar7 = 0; (ulong)uVar5 - 1 != lVar7; lVar7 = lVar7 + 1) {
              dVar20 = dVar20 + pdVar10[lVar7] * wa4[lVar7];
            }
            wa2[uVar6 - 1] = (dVar20 - wa3[uVar6 - 1]) / dVar17;
            wa1[uVar6 - 1] = ((wa1[uVar6 - 1] * diag[uVar6 - 1]) / dVar17) * diag[uVar6 - 1];
            if (0.0001 <= dVar18) {
              qtf[uVar6 - 1] = dVar20;
            }
            pdVar10 = (double *)((long)pdVar10 + local_78);
          }
          local_f0 = iVar15;
          local_90 = dVar21;
          r1updt_((int *)local_120,(int *)local_120,r__,lr,wa1,wa2,wa3,&sing);
          r1mpyq_((int *)m,(int *)m,local_110,local_100,wa2,wa3);
          r1mpyq_(&c__1,(int *)m,qtf,&c__1,wa2,wa3);
          local_cc = 0;
          local_b8 = local_90;
        } while( true );
      }
    }
  }
  *info = iflag;
LAB_001017b6:
  iflag = 0;
  if (0 < *nprint) {
    (*local_d8)(n,x,local_118,local_110,local_100,&iflag);
  }
  return;
LAB_0010236b:
  local_f0 = 2;
  local_b8 = dVar21;
  goto LAB_0010193c;
}

Assistant:

__minpack_attr__
void __minpack_func__(hybrj)(__minpack_decl_fcnder_nn__  const int *n, real *x, real *
	fvec, real *fjac, const int *ldfjac, const real *xtol, const int *
	maxfev, real *diag, const int *mode, const real *factor, const int *
	nprint, int *info, int *nfev, int *njev, real *r__, 
	const int *lr, real *qtf, real *wa1, real *wa2, 
	real *wa3, real *wa4)
{
    /* Initialized data */

#define p1 ((real).1)
#define p5 ((real).5)
#define p001 .001
#define p0001 1e-4
    const int c_false = FALSE_;
    const int c__1 = 1;

    /* System generated locals */
    int fjac_dim1, fjac_offset, i__1, i__2;
    real d__1, d__2;

    /* Local variables */
    int i__, j, l, jm1, iwa[1];
    real sum;
    int sing;
    int iter;
    real temp;
    int iflag;
    real delta;
    int jeval;
    int ncsuc;
    real ratio;
    real fnorm;
    real pnorm, xnorm = 0, fnorm1;
    int nslow1, nslow2;
    int ncfail;
    real actred, epsmch, prered;

/*     ********** */

/*     subroutine hybrj */

/*     the purpose of hybrj is to find a zero of a system of */
/*     n nonlinear functions in n variables by a modification */
/*     of the powell hybrid method. the user must provide a */
/*     subroutine which calculates the functions and the jacobian. */

/*     the subroutine statement is */

/*       subroutine hybrj(fcn,n,x,fvec,fjac,ldfjac,xtol,maxfev,diag, */
/*                        mode,factor,nprint,info,nfev,njev,r,lr,qtf, */
/*                        wa1,wa2,wa3,wa4) */

/*     where */

/*       fcn is the name of the user-supplied subroutine which */
/*         calculates the functions and the jacobian. fcn must */
/*         be declared in an external statement in the user */
/*         calling program, and should be written as follows. */

/*         subroutine fcn(n,x,fvec,fjac,ldfjac,iflag) */
/*         integer n,ldfjac,iflag */
/*         double precision x(n),fvec(n),fjac(ldfjac,n) */
/*         ---------- */
/*         if iflag = 1 calculate the functions at x and */
/*         return this vector in fvec. do not alter fjac. */
/*         if iflag = 2 calculate the jacobian at x and */
/*         return this matrix in fjac. do not alter fvec. */
/*         --------- */
/*         return */
/*         end */

/*         the value of iflag should not be changed by fcn unless */
/*         the user wants to terminate execution of hybrj. */
/*         in this case set iflag to a negative integer. */

/*       n is a positive integer input variable set to the number */
/*         of functions and variables. */

/*       x is an array of length n. on input x must contain */
/*         an initial estimate of the solution vector. on output x */
/*         contains the final estimate of the solution vector. */

/*       fvec is an output array of length n which contains */
/*         the functions evaluated at the output x. */

/*       fjac is an output n by n array which contains the */
/*         orthogonal matrix q produced by the qr factorization */
/*         of the final approximate jacobian. */

/*       ldfjac is a positive integer input variable not less than n */
/*         which specifies the leading dimension of the array fjac. */

/*       xtol is a nonnegative input variable. termination */
/*         occurs when the relative error between two consecutive */
/*         iterates is at most xtol. */

/*       maxfev is a positive integer input variable. termination */
/*         occurs when the number of calls to fcn with iflag = 1 */
/*         has reached maxfev. */

/*       diag is an array of length n. if mode = 1 (see */
/*         below), diag is internally set. if mode = 2, diag */
/*         must contain positive entries that serve as */
/*         multiplicative scale factors for the variables. */

/*       mode is an integer input variable. if mode = 1, the */
/*         variables will be scaled internally. if mode = 2, */
/*         the scaling is specified by the input diag. other */
/*         values of mode are equivalent to mode = 1. */

/*       factor is a positive input variable used in determining the */
/*         initial step bound. this bound is set to the product of */
/*         factor and the euclidean norm of diag*x if nonzero, or else */
/*         to factor itself. in most cases factor should lie in the */
/*         interval (.1,100.). 100. is a generally recommended value. */

/*       nprint is an integer input variable that enables controlled */
/*         printing of iterates if it is positive. in this case, */
/*         fcn is called with iflag = 0 at the beginning of the first */
/*         iteration and every nprint iterations thereafter and */
/*         immediately prior to return, with x and fvec available */
/*         for printing. fvec and fjac should not be altered. */
/*         if nprint is not positive, no special calls of fcn */
/*         with iflag = 0 are made. */

/*       info is an integer output variable. if the user has */
/*         terminated execution, info is set to the (negative) */
/*         value of iflag. see description of fcn. otherwise, */
/*         info is set as follows. */

/*         info = 0   improper input parameters. */

/*         info = 1   relative error between two consecutive iterates */
/*                    is at most xtol. */

/*         info = 2   number of calls to fcn with iflag = 1 has */
/*                    reached maxfev. */

/*         info = 3   xtol is too small. no further improvement in */
/*                    the approximate solution x is possible. */

/*         info = 4   iteration is not making good progress, as */
/*                    measured by the improvement from the last */
/*                    five jacobian evaluations. */

/*         info = 5   iteration is not making good progress, as */
/*                    measured by the improvement from the last */
/*                    ten iterations. */

/*       nfev is an integer output variable set to the number of */
/*         calls to fcn with iflag = 1. */

/*       njev is an integer output variable set to the number of */
/*         calls to fcn with iflag = 2. */

/*       r is an output array of length lr which contains the */
/*         upper triangular matrix produced by the qr factorization */
/*         of the final approximate jacobian, stored rowwise. */

/*       lr is a positive integer input variable not less than */
/*         (n*(n+1))/2. */

/*       qtf is an output array of length n which contains */
/*         the vector (q transpose)*fvec. */

/*       wa1, wa2, wa3, and wa4 are work arrays of length n. */

/*     subprograms called */

/*       user-supplied ...... fcn */

/*       minpack-supplied ... dogleg,dpmpar,enorm, */
/*                            qform,qrfac,r1mpyq,r1updt */

/*       fortran-supplied ... dabs,dmax1,dmin1,mod */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --wa4;
    --wa3;
    --wa2;
    --wa1;
    --qtf;
    --diag;
    --fvec;
    --x;
    fjac_dim1 = *ldfjac;
    fjac_offset = 1 + fjac_dim1 * 1;
    fjac -= fjac_offset;
    --r__;

    /* Function Body */

/*     epsmch is the machine precision. */

    epsmch = __minpack_func__(dpmpar)(&c__1);

    *info = 0;
    iflag = 0;
    *nfev = 0;
    *njev = 0;

/*     check the input parameters for errors. */

    if (*n <= 0 || *ldfjac < *n || *xtol < 0. || *maxfev <= 0 || *factor <= 
	    0. || *lr < *n * (*n + 1) / 2) {
	goto L300;
    }
    if (*mode != 2) {
	goto L20;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (diag[j] <= 0.) {
	    goto L300;
	}
/* L10: */
    }
L20:

/*     evaluate the function at the starting point */
/*     and calculate its norm. */

    iflag = 1;
    fcnder_nn(n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    *nfev = 1;
    if (iflag < 0) {
	goto L300;
    }
    fnorm = __minpack_func__(enorm)(n, &fvec[1]);

/*     initialize iteration counter and monitors. */

    iter = 1;
    ncsuc = 0;
    ncfail = 0;
    nslow1 = 0;
    nslow2 = 0;

/*     beginning of the outer loop. */

L30:
    jeval = TRUE_;

/*        calculate the jacobian matrix. */

    iflag = 2;
    fcnder_nn(n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    ++(*njev);
    if (iflag < 0) {
	goto L300;
    }

/*        compute the qr factorization of the jacobian. */

    __minpack_func__(qrfac)(n, n, &fjac[fjac_offset], ldfjac, &c_false, iwa, &c__1, &wa1[1], &
	    wa2[1], &wa3[1]);

/*        on the first iteration and if mode is 1, scale according */
/*        to the norms of the columns of the initial jacobian. */

    if (iter != 1) {
	goto L70;
    }
    if (*mode == 2) {
	goto L50;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	diag[j] = wa2[j];
	if (wa2[j] == 0.) {
	    diag[j] = 1.;
	}
/* L40: */
    }
L50:

/*        on the first iteration, calculate the norm of the scaled x */
/*        and initialize the step bound delta. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa3[j] = diag[j] * x[j];
/* L60: */
    }
    xnorm = __minpack_func__(enorm)(n, &wa3[1]);
    delta = *factor * xnorm;
    if (delta == 0.) {
	delta = *factor;
    }
L70:

/*        form (q transpose)*fvec and store in qtf. */

    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	qtf[i__] = fvec[i__];
/* L80: */
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (fjac[j + j * fjac_dim1] == 0.) {
	    goto L110;
	}
	sum = 0.;
	i__2 = *n;
	for (i__ = j; i__ <= i__2; ++i__) {
	    sum += fjac[i__ + j * fjac_dim1] * qtf[i__];
/* L90: */
	}
	temp = -sum / fjac[j + j * fjac_dim1];
	i__2 = *n;
	for (i__ = j; i__ <= i__2; ++i__) {
	    qtf[i__] += fjac[i__ + j * fjac_dim1] * temp;
/* L100: */
	}
L110:
/* L120: */
	;
    }

/*        copy the triangular factor of the qr factorization into r. */

    sing = FALSE_;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	l = j;
	jm1 = j - 1;
	if (jm1 < 1) {
	    goto L140;
	}
	i__2 = jm1;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    r__[l] = fjac[i__ + j * fjac_dim1];
	    l = l + *n - i__;
/* L130: */
	}
L140:
	r__[l] = wa1[j];
	if (wa1[j] == 0.) {
	    sing = TRUE_;
	}
/* L150: */
    }

/*        accumulate the orthogonal factor in fjac. */

    __minpack_func__(qform)(n, n, &fjac[fjac_offset], ldfjac, &wa1[1]);

/*        rescale if necessary. */

    if (*mode == 2) {
	goto L170;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/* Computing MAX */
	d__1 = diag[j], d__2 = wa2[j];
	diag[j] = max(d__1,d__2);
/* L160: */
    }
L170:

/*        beginning of the inner loop. */

L180:

/*           if requested, call fcn to enable printing of iterates. */

    if (*nprint <= 0) {
	goto L190;
    }
    iflag = 0;
    if ((iter - 1) % *nprint == 0) {
	fcnder_nn(n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    }
    if (iflag < 0) {
	goto L300;
    }
L190:

/*           determine the direction p. */

    __minpack_func__(dogleg)(n, &r__[1], lr, &diag[1], &qtf[1], &delta, &wa1[1], &wa2[1], &wa3[
	    1]);

/*           store the direction p and x + p. calculate the norm of p. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa1[j] = -wa1[j];
	wa2[j] = x[j] + wa1[j];
	wa3[j] = diag[j] * wa1[j];
/* L200: */
    }
    pnorm = __minpack_func__(enorm)(n, &wa3[1]);

/*           on the first iteration, adjust the initial step bound. */

    if (iter == 1) {
	delta = min(delta,pnorm);
    }

/*           evaluate the function at x + p and calculate its norm. */

    iflag = 1;
    fcnder_nn(n, &wa2[1], &wa4[1], &fjac[fjac_offset], ldfjac, &iflag);
    ++(*nfev);
    if (iflag < 0) {
	goto L300;
    }
    fnorm1 = __minpack_func__(enorm)(n, &wa4[1]);

/*           compute the scaled actual reduction. */

    actred = -1.;
    if (fnorm1 < fnorm) {
/* Computing 2nd power */
	d__1 = fnorm1 / fnorm;
	actred = 1 - d__1 * d__1;
    }

/*           compute the scaled predicted reduction. */

    l = 1;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	sum = 0.;
	i__2 = *n;
	for (j = i__; j <= i__2; ++j) {
	    sum += r__[l] * wa1[j];
	    ++l;
/* L210: */
	}
	wa3[i__] = qtf[i__] + sum;
/* L220: */
    }
    temp = __minpack_func__(enorm)(n, &wa3[1]);
    prered = 0.;
    if (temp < fnorm) {
/* Computing 2nd power */
	d__1 = temp / fnorm;
	prered = 1 - d__1 * d__1;
    }

/*           compute the ratio of the actual to the predicted */
/*           reduction. */

    ratio = 0.;
    if (prered > 0.) {
	ratio = actred / prered;
    }

/*           update the step bound. */

    if (ratio >= p1) {
	goto L230;
    }
    ncsuc = 0;
    ++ncfail;
    delta = p5 * delta;
    goto L240;
L230:
    ncfail = 0;
    ++ncsuc;
    if (ratio >= p5 || ncsuc > 1) {
/* Computing MAX */
	d__1 = delta, d__2 = pnorm / p5;
	delta = max(d__1,d__2);
    }
    if (fabs(ratio - 1) <= p1) {
	delta = pnorm / p5;
    }
L240:

/*           test for successful iteration. */

    if (ratio < p0001) {
	goto L260;
    }

/*           successful iteration. update x, fvec, and their norms. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	x[j] = wa2[j];
	wa2[j] = diag[j] * x[j];
	fvec[j] = wa4[j];
/* L250: */
    }
    xnorm = __minpack_func__(enorm)(n, &wa2[1]);
    fnorm = fnorm1;
    ++iter;
L260:

/*           determine the progress of the iteration. */

    ++nslow1;
    if (actred >= p001) {
	nslow1 = 0;
    }
    if (jeval) {
	++nslow2;
    }
    if (actred >= p1) {
	nslow2 = 0;
    }

/*           test for convergence. */

    if (delta <= *xtol * xnorm || fnorm == 0.) {
	*info = 1;
    }
    if (*info != 0) {
	goto L300;
    }

/*           tests for termination and stringent tolerances. */

    if (*nfev >= *maxfev) {
	*info = 2;
    }
/* Computing MAX */
    d__1 = p1 * delta;
    if (p1 * max(d__1,pnorm) <= epsmch * xnorm) {
	*info = 3;
    }
    if (nslow2 == 5) {
	*info = 4;
    }
    if (nslow1 == 10) {
	*info = 5;
    }
    if (*info != 0) {
	goto L300;
    }

/*           criterion for recalculating jacobian. */

    if (ncfail == 2) {
	goto L290;
    }

/*           calculate the rank one modification to the jacobian */
/*           and update qtf if necessary. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	sum = 0.;
	i__2 = *n;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    sum += fjac[i__ + j * fjac_dim1] * wa4[i__];
/* L270: */
	}
	wa2[j] = (sum - wa3[j]) / pnorm;
	wa1[j] = diag[j] * (diag[j] * wa1[j] / pnorm);
	if (ratio >= p0001) {
	    qtf[j] = sum;
	}
/* L280: */
    }

/*           compute the qr factorization of the updated jacobian. */

    __minpack_func__(r1updt)(n, n, &r__[1], lr, &wa1[1], &wa2[1], &wa3[1], &sing);
    __minpack_func__(r1mpyq)(n, n, &fjac[fjac_offset], ldfjac, &wa2[1], &wa3[1]);
    __minpack_func__(r1mpyq)(&c__1, n, &qtf[1], &c__1, &wa2[1], &wa3[1]);

/*           end of the inner loop. */

    jeval = FALSE_;
    goto L180;
L290:

/*        end of the outer loop. */

    goto L30;
L300:

/*     termination, either normal or user imposed. */

    if (iflag < 0) {
	*info = iflag;
    }
    iflag = 0;
    if (*nprint > 0) {
	fcnder_nn(n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    }
    return;

/*     last card of subroutine hybrj. */

}